

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O0

void find_next_key_frame(AV1_COMP *cpi,FIRSTPASS_STATS *this_frame)

{
  FIRSTPASS_STATS *position;
  int iVar1;
  int iVar2;
  uint uVar3;
  int64_t iVar4;
  int iVar5;
  void *in_RSI;
  AV1_COMP *in_RDI;
  double kf_raw_err_00;
  double dVar6;
  int64_t max_grp_bits;
  int max_bits;
  FIRSTPASS_STATS *this_stats;
  double kf_group_err;
  FIRSTPASS_STATS tmp_frame;
  int64_t kf_group_bits_clipped;
  int frames_to_key_clipped;
  int frames_to_key;
  double kf_group_avg_error;
  double sr_accumulator;
  double kf_mod_err;
  double kf_raw_err;
  double boost_score;
  double zero_motion_accumulator;
  int kf_bits;
  FIRSTPASS_STATS *start_position;
  int i;
  int num_frames_to_app_forced_key;
  FIRSTPASS_INFO *firstpass_info;
  FIRSTPASS_STATS next_frame;
  FIRSTPASS_STATS first_frame;
  KeyFrameCfg *kf_cfg;
  AV1EncoderConfig *oxcf;
  CurrentFrame *current_frame;
  AV1_COMMON *cm;
  FRAME_INFO *frame_info;
  GF_GROUP *gf_group;
  TWO_PASS *twopass;
  PRIMARY_RATE_CONTROL *p_rc;
  RATE_CONTROL *rc;
  FIRSTPASS_STATS *in_stack_fffffffffffffc28;
  AV1_COMP *in_stack_fffffffffffffc30;
  undefined4 in_stack_fffffffffffffc38;
  undefined4 in_stack_fffffffffffffc3c;
  undefined4 in_stack_fffffffffffffc40;
  undefined4 in_stack_fffffffffffffc44;
  int local_3b8;
  int local_3b4;
  double in_stack_fffffffffffffc50;
  RATE_CONTROL *in_stack_fffffffffffffc58;
  int in_stack_fffffffffffffc64;
  undefined4 in_stack_fffffffffffffc68;
  undefined4 in_stack_fffffffffffffc6c;
  FIRSTPASS_STATS *in_stack_fffffffffffffc70;
  undefined4 in_stack_fffffffffffffc78;
  int in_stack_fffffffffffffc7c;
  AV1_COMP *in_stack_fffffffffffffc80;
  double local_378;
  undefined1 local_370 [72];
  int in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  FIRSTPASS_INFO *in_stack_fffffffffffffce0;
  AV1_COMP *in_stack_fffffffffffffce8;
  int in_stack_fffffffffffffd24;
  FIRSTPASS_STATS *in_stack_fffffffffffffd28;
  FIRSTPASS_STATS *in_stack_fffffffffffffd30;
  TWO_PASS_FRAME *in_stack_fffffffffffffd38;
  TWO_PASS *in_stack_fffffffffffffd40;
  long local_288;
  int local_280;
  double *sr_accumulator_00;
  double *zero_motion_accumulator_00;
  AV1_COMP *cpi_00;
  int local_238;
  undefined1 local_228 [232];
  undefined1 local_140 [232];
  KeyFrameCfg *local_58;
  AV1EncoderConfig *local_50;
  AV1_COMMON *local_48;
  AV1_COMMON *local_40;
  FRAME_INFO *local_38;
  GF_GROUP *local_30;
  TWO_PASS *local_28;
  PRIMARY_RATE_CONTROL *local_20;
  RATE_CONTROL *local_18;
  void *local_10;
  AV1_COMP *local_8;
  
  local_18 = &in_RDI->rc;
  local_20 = &in_RDI->ppi->p_rc;
  local_28 = &in_RDI->ppi->twopass;
  local_30 = &in_RDI->ppi->gf_group;
  local_38 = &in_RDI->frame_info;
  local_48 = &in_RDI->common;
  local_50 = &in_RDI->oxcf;
  local_58 = &(in_RDI->oxcf).kf_cfg;
  local_40 = local_48;
  local_10 = in_RSI;
  local_8 = in_RDI;
  memcpy(local_140,in_RSI,0xe8);
  memset(local_228,0,0xe8);
  local_18->frames_since_key = 0;
  iVar1 = is_altref_enabled((local_50->gf_cfg).lag_in_frames,
                            (_Bool)((local_50->gf_cfg).enable_auto_arf & 1));
  local_20->use_arf_in_this_kf_group = iVar1;
  memset(local_30,0,0x58f4);
  local_8->gf_frame_index = '\0';
  local_18->frames_till_gf_update_due = 0;
  iVar1 = has_no_stats_stage(local_8);
  if (iVar1 == 0) {
    position = (local_8->twopass_frame).stats_in;
    zero_motion_accumulator_00 = (double *)0x0;
    sr_accumulator_00 = (double *)0x0;
    local_280 = 0x7fffffff;
    local_288 = 0x7fffffffffffffff;
    local_20->this_key_frame_forced = local_20->next_key_frame_forced;
    local_28->kf_group_bits = 0;
    local_28->kf_group_error_left = 0.0;
    cpi_00 = *(AV1_COMP **)((long)local_10 + 0x10);
    kf_raw_err_00 =
         calculate_modified_err
                   ((FRAME_INFO *)CONCAT44(in_stack_fffffffffffffc44,in_stack_fffffffffffffc40),
                    (TWO_PASS *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                    (AV1EncoderConfig *)in_stack_fffffffffffffc30,in_stack_fffffffffffffc28);
    iVar1 = define_kf_interval(in_stack_fffffffffffffce8,in_stack_fffffffffffffce0,
                               in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8);
    if (iVar1 == -1) {
      local_18->frames_to_key = local_58->key_freq_max;
    }
    else {
      in_stack_fffffffffffffc64 = iVar1;
      if (local_58->key_freq_max < iVar1) {
        in_stack_fffffffffffffc64 = local_58->key_freq_max;
      }
      local_18->frames_to_key = in_stack_fffffffffffffc64;
    }
    if (local_8->ppi->lap_enabled != 0) {
      correct_frames_to_key(in_stack_fffffffffffffc30);
    }
    if (((local_58->auto_key & 1U) == 0) || (local_18->frames_to_key <= local_58->key_freq_max)) {
      if ((((local_8->twopass_frame).stats_in == local_28->stats_buf_ctx->stats_in_end) &&
          (iVar2 = is_stat_consumption_stage_twopass(local_8), iVar2 != 0)) ||
         (local_58->key_freq_max <= local_18->frames_to_key)) {
        local_20->next_key_frame_forced = 1;
      }
      else {
        local_20->next_key_frame_forced = 0;
      }
    }
    else {
      memcpy(local_370,local_140,0xe8);
      local_18->frames_to_key = local_18->frames_to_key / 2;
      in_stack_fffffffffffffc58 = local_18;
      reset_fpf_position(&local_8->twopass_frame,position);
      local_238 = 0;
      while ((local_238 < local_18->frames_to_key &&
             (iVar2 = input_stats((TWO_PASS *)
                                  CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38),
                                  (TWO_PASS_FRAME *)in_stack_fffffffffffffc30,
                                  in_stack_fffffffffffffc28), iVar2 != -1))) {
        local_238 = local_238 + 1;
      }
      local_20->next_key_frame_forced = 1;
    }
    local_378 = 0.0;
    for (local_238 = 0; local_238 < local_18->frames_to_key; local_238 = local_238 + 1) {
      in_stack_fffffffffffffc80 =
           (AV1_COMP *)av1_firstpass_info_peek(&local_28->firstpass_info,local_238);
      if (in_stack_fffffffffffffc80 != (AV1_COMP *)0x0) {
        dVar6 = calculate_modified_err_new
                          ((FRAME_INFO *)
                           CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78),
                           in_stack_fffffffffffffc70,
                           (FIRSTPASS_STATS *)
                           CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                           in_stack_fffffffffffffc64,(double)in_stack_fffffffffffffc58,
                           in_stack_fffffffffffffc50);
        local_378 = dVar6 + local_378;
        local_20->num_stats_used_for_kf_boost = local_20->num_stats_used_for_kf_boost + 1;
      }
    }
    if (((0 < local_28->bits_left) && (0.0 < local_28->modified_error_left)) ||
       ((local_8->ppi->lap_enabled != 0 && ((local_50->rc_cfg).mode != AOM_Q)))) {
      in_stack_fffffffffffffc7c = frame_max_bits(local_18,local_50);
      if ((local_50->rc_cfg).vbr_corpus_complexity_lap != 0) {
        sr_accumulator_00 =
             (double *)
             get_kf_group_avg_error
                       (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                        in_stack_fffffffffffffd30,in_stack_fffffffffffffd28,
                        in_stack_fffffffffffffd24);
      }
      iVar4 = get_kf_group_bits(local_8,local_378,(double)sr_accumulator_00);
      local_28->kf_group_bits = iVar4;
      in_stack_fffffffffffffc70 =
           (FIRSTPASS_STATS *)((long)in_stack_fffffffffffffc7c * (long)local_18->frames_to_key);
      if ((long)in_stack_fffffffffffffc70 < local_28->kf_group_bits) {
        local_28->kf_group_bits = (int64_t)in_stack_fffffffffffffc70;
      }
    }
    else {
      local_28->kf_group_bits = 0;
    }
    iVar2 = (int)((ulong)in_stack_fffffffffffffc70 >> 0x20);
    if (local_28->kf_group_bits < 0) {
      iVar4 = 0;
    }
    else {
      iVar4 = local_28->kf_group_bits;
    }
    local_28->kf_group_bits = iVar4;
    if ((local_8->ppi->lap_enabled != 0) &&
       (local_280 = (int)(local_8->framerate * 5.0), local_280 < local_18->frames_to_key)) {
      local_288 = (long)(((double)local_28->kf_group_bits * (double)local_280) /
                        (double)local_18->frames_to_key);
    }
    reset_fpf_position(&local_8->twopass_frame,position);
    dVar6 = get_kf_boost_score(cpi_00,kf_raw_err_00,zero_motion_accumulator_00,sr_accumulator_00,
                               iVar1);
    reset_fpf_position(&local_8->twopass_frame,position);
    local_28->kf_zeromotion_pct = 100;
    uVar3 = calculate_section_intra_ratio
                      (position,local_28->stats_buf_ctx->stats_in_end,local_18->frames_to_key);
    local_28->section_intra_rating = uVar3;
    local_20->kf_boost = (int)dVar6;
    if (local_8->ppi->lap_enabled != 0) {
      if ((local_50->rc_cfg).mode == AOM_Q) {
        iVar1 = get_projected_kf_boost
                          ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffc3c,in_stack_fffffffffffffc38)
                          );
        local_20->kf_boost = iVar1;
      }
      else {
        dVar6 = get_kf_boost_score(cpi_00,kf_raw_err_00,zero_motion_accumulator_00,sr_accumulator_00
                                   ,iVar1);
        reset_fpf_position(&local_8->twopass_frame,position);
        local_20->kf_boost = (int)dVar6 + local_20->kf_boost;
      }
    }
    if (local_18->frames_to_key < 9) {
      iVar1 = local_20->kf_boost;
      iVar5 = local_18->frames_to_key * 3;
      if (iVar1 == iVar5 || SBORROW4(iVar1,iVar5) != iVar1 + local_18->frames_to_key * -3 < 0) {
        local_3b8 = local_18->frames_to_key * 3;
      }
      else {
        local_3b8 = local_20->kf_boost;
      }
      local_20->kf_boost = local_3b8;
      if (local_20->kf_boost < 0x259) {
        iVar1 = 600;
      }
      else {
        iVar1 = local_20->kf_boost;
      }
      local_20->kf_boost = iVar1;
    }
    else {
      if (local_20->kf_boost < 0x1519) {
        local_3b4 = 0x1518;
      }
      else {
        local_3b4 = local_20->kf_boost;
      }
      local_20->kf_boost = local_3b4;
    }
    if (local_18->frames_to_key < local_280) {
      local_280 = local_18->frames_to_key;
    }
    if (local_28->kf_group_bits < local_288) {
      local_288 = local_28->kf_group_bits;
    }
    calculate_boost_bits(local_280 + -1,local_20->kf_boost,local_288);
    iVar1 = adjust_boost_bits_for_target_level
                      (in_stack_fffffffffffffc80,
                       (RATE_CONTROL *)CONCAT44(in_stack_fffffffffffffc7c,in_stack_fffffffffffffc78)
                       ,iVar2,CONCAT44(in_stack_fffffffffffffc6c,in_stack_fffffffffffffc68),
                       in_stack_fffffffffffffc64);
    local_28->kf_group_bits = local_28->kf_group_bits - (long)iVar1;
    local_30->bit_allocation[0] = iVar1;
    local_30->update_type[0] = '\0';
    if (local_8->ppi->lap_enabled == 0) {
      local_28->kf_group_error_left = local_378 - kf_raw_err_00;
    }
    else {
      local_28->kf_group_error_left = (double)(local_18->frames_to_key + -1);
    }
    local_28->modified_error_left = local_28->modified_error_left - local_378;
  }
  else {
    iVar1 = detect_app_forced_key(in_stack_fffffffffffffc30);
    uVar3 = 0;
    if ((local_48->current_frame).frame_number != 0) {
      uVar3 = (uint)(local_18->frames_to_key == 0) << 0x18;
    }
    local_20->this_key_frame_forced = uVar3 >> 0x18;
    if (iVar1 == -1) {
      if (local_58->key_freq_max < 1) {
        iVar1 = 1;
      }
      else {
        iVar1 = local_58->key_freq_max;
      }
      local_18->frames_to_key = iVar1;
    }
    else {
      local_18->frames_to_key = iVar1;
    }
    correct_frames_to_key(in_stack_fffffffffffffc30);
    local_20->kf_boost = 0x8fc;
    local_30->update_type[0] = '\0';
  }
  return;
}

Assistant:

static void find_next_key_frame(AV1_COMP *cpi, FIRSTPASS_STATS *this_frame) {
  RATE_CONTROL *const rc = &cpi->rc;
  PRIMARY_RATE_CONTROL *const p_rc = &cpi->ppi->p_rc;
  TWO_PASS *const twopass = &cpi->ppi->twopass;
  GF_GROUP *const gf_group = &cpi->ppi->gf_group;
  FRAME_INFO *const frame_info = &cpi->frame_info;
  AV1_COMMON *const cm = &cpi->common;
  CurrentFrame *const current_frame = &cm->current_frame;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  const KeyFrameCfg *const kf_cfg = &oxcf->kf_cfg;
  const FIRSTPASS_STATS first_frame = *this_frame;
  FIRSTPASS_STATS next_frame;
  const FIRSTPASS_INFO *firstpass_info = &twopass->firstpass_info;
  av1_zero(next_frame);

  rc->frames_since_key = 0;
  // Use arfs if possible.
  p_rc->use_arf_in_this_kf_group = is_altref_enabled(
      oxcf->gf_cfg.lag_in_frames, oxcf->gf_cfg.enable_auto_arf);

  // Reset the GF group data structures.
  av1_zero(*gf_group);
  cpi->gf_frame_index = 0;

  // KF is always a GF so clear frames till next gf counter.
  rc->frames_till_gf_update_due = 0;

  if (has_no_stats_stage(cpi)) {
    int num_frames_to_app_forced_key = detect_app_forced_key(cpi);
    p_rc->this_key_frame_forced =
        current_frame->frame_number != 0 && rc->frames_to_key == 0;
    if (num_frames_to_app_forced_key != -1)
      rc->frames_to_key = num_frames_to_app_forced_key;
    else
      rc->frames_to_key = AOMMAX(1, kf_cfg->key_freq_max);
    correct_frames_to_key(cpi);
    p_rc->kf_boost = DEFAULT_KF_BOOST;
    gf_group->update_type[0] = KF_UPDATE;
    return;
  }
  int i;
  const FIRSTPASS_STATS *const start_position = cpi->twopass_frame.stats_in;
  int kf_bits = 0;
  double zero_motion_accumulator = 1.0;
  double boost_score = 0.0;
  double kf_raw_err = 0.0;
  double kf_mod_err = 0.0;
  double sr_accumulator = 0.0;
  double kf_group_avg_error = 0.0;
  int frames_to_key, frames_to_key_clipped = INT_MAX;
  int64_t kf_group_bits_clipped = INT64_MAX;

  // Is this a forced key frame by interval.
  p_rc->this_key_frame_forced = p_rc->next_key_frame_forced;

  twopass->kf_group_bits = 0;        // Total bits available to kf group
  twopass->kf_group_error_left = 0;  // Group modified error score.

  kf_raw_err = this_frame->intra_error;
  kf_mod_err = calculate_modified_err(frame_info, twopass, oxcf, this_frame);

  // We assume the current frame is a key frame and we are looking for the next
  // key frame. Therefore search_start_idx = 1
  frames_to_key = define_kf_interval(cpi, firstpass_info, kf_cfg->key_freq_max,
                                     /*search_start_idx=*/1);

  if (frames_to_key != -1) {
    rc->frames_to_key = AOMMIN(kf_cfg->key_freq_max, frames_to_key);
  } else {
    rc->frames_to_key = kf_cfg->key_freq_max;
  }

  if (cpi->ppi->lap_enabled) correct_frames_to_key(cpi);

  // If there is a max kf interval set by the user we must obey it.
  // We already breakout of the loop above at 2x max.
  // This code centers the extra kf if the actual natural interval
  // is between 1x and 2x.
  if (kf_cfg->auto_key && rc->frames_to_key > kf_cfg->key_freq_max) {
    FIRSTPASS_STATS tmp_frame = first_frame;

    rc->frames_to_key /= 2;

    // Reset to the start of the group.
    reset_fpf_position(&cpi->twopass_frame, start_position);
    // Rescan to get the correct error data for the forced kf group.
    for (i = 0; i < rc->frames_to_key; ++i) {
      if (EOF == input_stats(twopass, &cpi->twopass_frame, &tmp_frame)) break;
    }
    p_rc->next_key_frame_forced = 1;
  } else if ((cpi->twopass_frame.stats_in ==
                  twopass->stats_buf_ctx->stats_in_end &&
              is_stat_consumption_stage_twopass(cpi)) ||
             rc->frames_to_key >= kf_cfg->key_freq_max) {
    p_rc->next_key_frame_forced = 1;
  } else {
    p_rc->next_key_frame_forced = 0;
  }

  double kf_group_err = 0;
  for (i = 0; i < rc->frames_to_key; ++i) {
    const FIRSTPASS_STATS *this_stats =
        av1_firstpass_info_peek(&twopass->firstpass_info, i);
    if (this_stats != NULL) {
      // Accumulate kf group error.
      kf_group_err += calculate_modified_err_new(
          frame_info, &firstpass_info->total_stats, this_stats,
          oxcf->rc_cfg.vbrbias, twopass->modified_error_min,
          twopass->modified_error_max);
      ++p_rc->num_stats_used_for_kf_boost;
    }
  }

  // Calculate the number of bits that should be assigned to the kf group.
  if ((twopass->bits_left > 0 && twopass->modified_error_left > 0.0) ||
      (cpi->ppi->lap_enabled && oxcf->rc_cfg.mode != AOM_Q)) {
    // Maximum number of bits for a single normal frame (not key frame).
    const int max_bits = frame_max_bits(rc, oxcf);

    // Maximum number of bits allocated to the key frame group.
    int64_t max_grp_bits;

    if (oxcf->rc_cfg.vbr_corpus_complexity_lap) {
      kf_group_avg_error =
          get_kf_group_avg_error(twopass, &cpi->twopass_frame, &first_frame,
                                 start_position, rc->frames_to_key);
    }

    // Default allocation based on bits left and relative
    // complexity of the section.
    twopass->kf_group_bits =
        get_kf_group_bits(cpi, kf_group_err, kf_group_avg_error);
    // Clip based on maximum per frame rate defined by the user.
    max_grp_bits = (int64_t)max_bits * (int64_t)rc->frames_to_key;
    if (twopass->kf_group_bits > max_grp_bits)
      twopass->kf_group_bits = max_grp_bits;
  } else {
    twopass->kf_group_bits = 0;
  }
  twopass->kf_group_bits = AOMMAX(0, twopass->kf_group_bits);

  if (cpi->ppi->lap_enabled) {
    // In the case of single pass based on LAP, frames to  key may have an
    // inaccurate value, and hence should be clipped to an appropriate
    // interval.
    frames_to_key_clipped =
        (int)(MAX_KF_BITS_INTERVAL_SINGLE_PASS * cpi->framerate);

    // This variable calculates the bits allocated to kf_group with a clipped
    // frames_to_key.
    if (rc->frames_to_key > frames_to_key_clipped) {
      kf_group_bits_clipped =
          (int64_t)((double)twopass->kf_group_bits * frames_to_key_clipped /
                    rc->frames_to_key);
    }
  }

  // Reset the first pass file position.
  reset_fpf_position(&cpi->twopass_frame, start_position);

  // Scan through the kf group collating various stats used to determine
  // how many bits to spend on it.
  boost_score = get_kf_boost_score(cpi, kf_raw_err, &zero_motion_accumulator,
                                   &sr_accumulator, 0);
  reset_fpf_position(&cpi->twopass_frame, start_position);
  // Store the zero motion percentage
  twopass->kf_zeromotion_pct = (int)(zero_motion_accumulator * 100.0);

  // Calculate a section intra ratio used in setting max loop filter.
  twopass->section_intra_rating = calculate_section_intra_ratio(
      start_position, twopass->stats_buf_ctx->stats_in_end, rc->frames_to_key);

  p_rc->kf_boost = (int)boost_score;

  if (cpi->ppi->lap_enabled) {
    if (oxcf->rc_cfg.mode == AOM_Q) {
      p_rc->kf_boost = get_projected_kf_boost(cpi);
    } else {
      // TODO(any): Explore using average frame stats for AOM_Q as well.
      boost_score = get_kf_boost_score(
          cpi, kf_raw_err, &zero_motion_accumulator, &sr_accumulator, 1);
      reset_fpf_position(&cpi->twopass_frame, start_position);
      p_rc->kf_boost += (int)boost_score;
    }
  }

  // Special case for static / slide show content but don't apply
  // if the kf group is very short.
  if ((zero_motion_accumulator > STATIC_KF_GROUP_FLOAT_THRESH) &&
      (rc->frames_to_key > 8)) {
    p_rc->kf_boost = AOMMAX(p_rc->kf_boost, MIN_STATIC_KF_BOOST);
  } else {
    // Apply various clamps for min and max boost
    p_rc->kf_boost = AOMMAX(p_rc->kf_boost, (rc->frames_to_key * 3));
    p_rc->kf_boost = AOMMAX(p_rc->kf_boost, MIN_KF_BOOST);
#ifdef STRICT_RC
    p_rc->kf_boost = AOMMIN(p_rc->kf_boost, MAX_KF_BOOST);
#endif
  }

  // Work out how many bits to allocate for the key frame itself.
  // In case of LAP enabled for VBR, if the frames_to_key value is
  // very high, we calculate the bits based on a clipped value of
  // frames_to_key.
  kf_bits = calculate_boost_bits(
      AOMMIN(rc->frames_to_key, frames_to_key_clipped) - 1, p_rc->kf_boost,
      AOMMIN(twopass->kf_group_bits, kf_group_bits_clipped));
  kf_bits = adjust_boost_bits_for_target_level(cpi, rc, kf_bits,
                                               twopass->kf_group_bits, 0);

  twopass->kf_group_bits -= kf_bits;

  // Save the bits to spend on the key frame.
  gf_group->bit_allocation[0] = kf_bits;
  gf_group->update_type[0] = KF_UPDATE;

  // Note the total error score of the kf group minus the key frame itself.
  if (cpi->ppi->lap_enabled)
    // As we don't have enough stats to know the actual error of the group,
    // we assume the complexity of each frame to be equal to 1, and set the
    // error as the number of frames in the group(minus the keyframe).
    twopass->kf_group_error_left = (double)(rc->frames_to_key - 1);
  else
    twopass->kf_group_error_left = kf_group_err - kf_mod_err;

  // Adjust the count of total modified error left.
  // The count of bits left is adjusted elsewhere based on real coded frame
  // sizes.
  twopass->modified_error_left -= kf_group_err;
}